

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O2

UINT8 Pulse_SetStreamDesc(void *drvObj,char *streamDesc)

{
  char *pcVar1;
  DRV_PULSE *drv;
  
  if (*(long *)((long)drvObj + 0x48) != 0) {
    return '\x18';
  }
  free(*(void **)((long)drvObj + 0x58));
  pcVar1 = strdup(streamDesc);
  *(char **)((long)drvObj + 0x58) = pcVar1;
  return '\0';
}

Assistant:

UINT8 Pulse_SetStreamDesc(void* drvObj, const char* streamDesc)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	
	//The Simple API does not accept updates to the stream description
	if (drv->hPulse)
		return AERR_WASDONE;
	
	free(drv->streamDesc);
	drv->streamDesc = strdup(streamDesc);
	
	return AERR_OK;
}